

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O2

void __thiscall
bgui::ImageWindow::visibleImagePart(ImageWindow *this,long *x,long *y,long *w,long *h)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  int hh;
  long *local_a0;
  long *local_98;
  long *local_90;
  int ww;
  SVector<long,_2> p2;
  SVector<long,_2> p1;
  SVector<long,_3> q2;
  SVector<long,_3> q1;
  
  if (this->adapt == (ImageAdapterBase *)0x0) {
    *y = 0;
    *x = 0;
    *h = -1;
    *w = -1;
  }
  else {
    local_a0 = y;
    local_98 = w;
    local_90 = h;
    BaseWindow::getSize(&this->super_BaseWindow,&ww,&hh);
    dVar1 = this->adapt->scale;
    gmath::SVector<long,_3>::SVector(&q1);
    gmath::SVector<long,_3>::SVector(&q2);
    iVar3 = this->imx;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar2 = 0;
    if (0 < this->imy) {
      iVar2 = this->imy;
    }
    q1.v[1] = (long)((double)iVar2 / dVar1);
    q1.v[2] = 1;
    q1.v[0] = (long)((double)iVar3 / dVar1);
    iVar2 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    lVar4 = q1.v[1];
    lVar5 = (long)ww;
    if (CONCAT44(extraout_var,iVar2) < (long)ww) {
      lVar5 = CONCAT44(extraout_var,iVar2);
    }
    q2.v[0] = (long)((double)lVar5 / dVar1) + (long)((double)iVar3 / dVar1);
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    lVar5 = (long)hh;
    if (CONCAT44(extraout_var_00,iVar3) < (long)hh) {
      lVar5 = CONCAT44(extraout_var_00,iVar3);
    }
    q2.v[1] = (long)((double)lVar5 / dVar1) + lVar4;
    q2.v[2] = 1;
    gmath::SMatrix<long,_2,_3>::operator*
              ((SMatrix<long,_2,_3> *)&p1,(SVector<long,_3> *)&this->adapt->R);
    gmath::SMatrix<long,_2,_3>::operator*
              ((SMatrix<long,_2,_3> *)&p2,(SVector<long,_3> *)&this->adapt->R);
    lVar4 = p1.v[0];
    if (p2.v[0] < p1.v[0]) {
      lVar4 = p2.v[0];
    }
    *x = lVar4;
    lVar4 = p1.v[1];
    if (p2.v[1] < p1.v[1]) {
      lVar4 = p2.v[1];
    }
    *local_a0 = lVar4;
    if (p2.v[0] < p1.v[0]) {
      p2.v[0] = p1.v[0];
    }
    if (p2.v[1] < p1.v[1]) {
      p2.v[1] = p1.v[1];
    }
    *local_98 = p2.v[0] - *x;
    *local_90 = p2.v[1] - *local_a0;
  }
  return;
}

Assistant:

void ImageWindow::visibleImagePart(long &x, long &y, long &w, long &h)
{
  if (adapt != 0)
  {
    int ww, hh;
    getSize(ww, hh);

    double scale=adapt->getScale();

    gmath::SVector<long, 3> q1, q2;

    q1[0]=static_cast<long>(std::max(imx, 0)/scale);
    q1[1]=static_cast<long>(std::max(imy, 0)/scale);
    q1[2]=1;

    q2[0]=q1[0]+static_cast<long>(std::min(static_cast<long>(ww), adapt->getWidth())/scale);
    q2[1]=q1[1]+static_cast<long>(std::min(static_cast<long>(hh), adapt->getHeight())/scale);
    q2[2]=1;

    const gmath::SVector<long, 2> p1=adapt->getRotationMatrix()*q1;
    const gmath::SVector<long, 2> p2=adapt->getRotationMatrix()*q2;

    x=std::min(p1[0], p2[0]);
    y=std::min(p1[1], p2[1]);
    w=std::max(p1[0], p2[0])-x;
    h=std::max(p1[1], p2[1])-y;
  }
  else
  {
    x=y=0;
    w=h=-1;
  }
}